

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currunit.cpp
# Opt level: O2

int __thiscall
icu_63::CurrencyUnit::clone
          (CurrencyUnit *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CurrencyUnit *this_00;
  
  this_00 = (CurrencyUnit *)UMemory::operator_new((UMemory *)0x20,(size_t)__fn);
  if (this_00 != (CurrencyUnit *)0x0) {
    CurrencyUnit(this_00,this);
  }
  return (int)this_00;
}

Assistant:

UObject* CurrencyUnit::clone() const {
    return new CurrencyUnit(*this);
}